

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error atomic_size<20>(context *ctx,token *token,opcode *op)

{
  bool bVar1;
  int iVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  undefined8 in_RCX;
  optional<unsigned_long> oVar5;
  int local_c4;
  token local_c0;
  token local_98;
  token local_70;
  string_view local_48;
  _Storage<unsigned_long,_true> local_38;
  optional<unsigned_long> result;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = in_RCX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,".");
  oVar5 = find_in_table((token *)op,atomic_size<20>::table,local_48);
  local_38._M_value =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
  if (bVar1) {
    context::tokenize(&local_70,(context *)token);
    *(int *)&op[2].value = local_70.column;
    op[1].value = (uint64_t)local_70.data.string._M_str;
    op[1].reuse = local_70.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_70.line;
    op->value = (uint64_t)local_70.filename;
    op->reuse = local_70.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_70.data.predicate.negated;
    puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_38);
    if (*puVar3 == 3) {
      iVar2 = equal((token *)op,".FTZ");
      if (iVar2 == 0) {
        fail((token *)ctx,(char *)op,atomic_size<20>::msg);
        return (unique_ptr<char[],_std::default_delete<char[]>_>)
               (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
      }
      context::tokenize(&local_98,(context *)token);
      memcpy(op,&local_98,0x24);
    }
    else if (*puVar3 != 4) goto LAB_0013b54d;
    iVar2 = equal((token *)op,".RN");
    if (iVar2 == 0) {
      fail((token *)ctx,(char *)op,atomic_size<20>::msg);
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
    }
    context::tokenize(&local_c0,(context *)token);
    memcpy(op,&local_c0,0x24);
  }
LAB_0013b54d:
  local_c4 = 0;
  uVar4 = std::optional<unsigned_long>::value_or<int>
                    ((optional<unsigned_long> *)&local_38,&local_c4);
  opcode::add_bits((opcode *)
                   result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._8_8_,uVar4 << 0x14);
  memset(ctx,0,8);
  error::error((error *)ctx);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(atomic_size)
{
    static const char* msg = "expected .U32, .S32, .U64, .S64, .F32.FTZ.RN, .F16x2.RN or .S64";
    static const char* table[] = {"U32", "S32", "U64", "F32", "F16x2", "S64", nullptr};
    const std::optional<uint64_t> result = find_in_table(token, table, ".");
    if (result) {
        token = ctx.tokenize();
        switch (*result) {
        case 3: // .F32.FTZ.RN
            if (!equal(token, ".FTZ")) {
                return fail(token, msg);
            }
            token = ctx.tokenize();
            [[fallthrough]];
        case 4: // .F16x2.RN
            if (!equal(token, ".RN")) {
                return fail(token, msg);
            }
            token = ctx.tokenize();
        }
    }
    op.add_bits(result.value_or(0) << address);
    return {};
}